

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varintdecode.c
# Opt level: O0

size_t masked_vbyte_read_loop(uint8_t *in,uint32_t *out,int len_signed)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [16];
  uint6 uVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  uint64_t uVar7;
  int in_EDX;
  long in_RSI;
  undefined1 (*in_RDI) [32];
  uint64_t eaten;
  uint64_t ints_read_1;
  int newsig;
  uint64_t newsigavx;
  uint64_t bytes;
  uint64_t ints_read;
  uint64_t reload;
  uint64_t remaining;
  uint64_t thisSig;
  uint64_t nextSig;
  uint32_t highSig;
  __m128i high;
  uint32_t lowSig;
  __m256i low;
  size_t scanned;
  int availablebytes;
  uint64_t sig;
  uint64_t count;
  size_t consumed;
  uint64_t length;
  long local_1f0;
  long local_1d0;
  ulong local_1b0;
  long local_148;
  int local_13c;
  ulong local_138;
  ulong local_130;
  size_t local_128;
  uint64_t *in_stack_ffffffffffffff58;
  uint64_t in_stack_ffffffffffffff60;
  uint32_t *in_stack_ffffffffffffff68;
  uint8_t *in_stack_ffffffffffffff70;
  
  uVar5 = (ulong)in_EDX;
  local_128 = 0;
  local_130 = 0;
  local_138 = 0;
  local_13c = 0;
  if (0x60 < uVar5) {
    in_stack_ffffffffffffff60 = *(uint64_t *)*in_RDI;
    in_stack_ffffffffffffff68 = *(uint32_t **)(*in_RDI + 8);
    in_stack_ffffffffffffff70 = *(uint8_t **)(*in_RDI + 0x10);
    auVar1 = *in_RDI;
    auVar2 = *(undefined1 (*) [16])in_RDI[1];
    uVar3 = CONCAT24((ushort)(SUB161(auVar2 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar2 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar2 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar2 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar2 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar2 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar2 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar2 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar2 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar2 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar2 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar2 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar2 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar2 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar2 >> 0x77,0) & 1) << 0xe |
                     (ushort)(byte)((ulong)*(undefined8 *)(in_RDI[1] + 8) >> 0x3f) << 0xf,
                     (uint)(SUB321(auVar1 >> 7,0) & 1) | (uint)(SUB321(auVar1 >> 0xf,0) & 1) << 1 |
                     (uint)(SUB321(auVar1 >> 0x17,0) & 1) << 2 |
                     (uint)(SUB321(auVar1 >> 0x1f,0) & 1) << 3 |
                     (uint)(SUB321(auVar1 >> 0x27,0) & 1) << 4 |
                     (uint)(SUB321(auVar1 >> 0x2f,0) & 1) << 5 |
                     (uint)(SUB321(auVar1 >> 0x37,0) & 1) << 6 |
                     (uint)(SUB321(auVar1 >> 0x3f,0) & 1) << 7 |
                     (uint)(SUB321(auVar1 >> 0x47,0) & 1) << 8 |
                     (uint)(SUB321(auVar1 >> 0x4f,0) & 1) << 9 |
                     (uint)(SUB321(auVar1 >> 0x57,0) & 1) << 10 |
                     (uint)(SUB321(auVar1 >> 0x5f,0) & 1) << 0xb |
                     (uint)(SUB321(auVar1 >> 0x67,0) & 1) << 0xc |
                     (uint)(SUB321(auVar1 >> 0x6f,0) & 1) << 0xd |
                     (uint)(SUB321(auVar1 >> 0x77,0) & 1) << 0xe |
                     (uint)SUB321(auVar1 >> 0x7f,0) << 0xf |
                     (uint)(SUB321(auVar1 >> 0x87,0) & 1) << 0x10 |
                     (uint)(SUB321(auVar1 >> 0x8f,0) & 1) << 0x11 |
                     (uint)(SUB321(auVar1 >> 0x97,0) & 1) << 0x12 |
                     (uint)(SUB321(auVar1 >> 0x9f,0) & 1) << 0x13 |
                     (uint)(SUB321(auVar1 >> 0xa7,0) & 1) << 0x14 |
                     (uint)(SUB321(auVar1 >> 0xaf,0) & 1) << 0x15 |
                     (uint)(SUB321(auVar1 >> 0xb7,0) & 1) << 0x16 |
                     (uint)SUB321(auVar1 >> 0xbf,0) << 0x17 |
                     (uint)(SUB321(auVar1 >> 199,0) & 1) << 0x18 |
                     (uint)(SUB321(auVar1 >> 0xcf,0) & 1) << 0x19 |
                     (uint)(SUB321(auVar1 >> 0xd7,0) & 1) << 0x1a |
                     (uint)(SUB321(auVar1 >> 0xdf,0) & 1) << 0x1b |
                     (uint)(SUB321(auVar1 >> 0xe7,0) & 1) << 0x1c |
                     (uint)(SUB321(auVar1 >> 0xef,0) & 1) << 0x1d |
                     (uint)(SUB321(auVar1 >> 0xf7,0) & 1) << 0x1e |
                     (uint)(byte)((ulong)*(undefined8 *)(*in_RDI + 0x18) >> 0x3f) << 0x1f);
    local_148 = 0x30;
    do {
      local_1b0 = (ulong)uVar3;
      in_stack_ffffffffffffff58 = *(uint64_t **)(*(undefined1 (*) [32])(*in_RDI + local_148) + 0x18)
      ;
      auVar1 = *(undefined1 (*) [32])(*in_RDI + local_148);
      auVar2 = *(undefined1 (*) [16])(in_RDI[1] + local_148);
      uVar3 = CONCAT24((ushort)(SUB161(auVar2 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar2 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar2 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar2 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar2 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar2 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar2 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar2 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar2 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar2 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar2 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar2 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar2 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar2 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar2 >> 0x77,0) & 1) << 0xe |
                       (ushort)(byte)((ulong)*(undefined8 *)(in_RDI[1] + local_148 + 8) >> 0x3f) <<
                       0xf,(uint)(SUB321(auVar1 >> 7,0) & 1) |
                           (uint)(SUB321(auVar1 >> 0xf,0) & 1) << 1 |
                           (uint)(SUB321(auVar1 >> 0x17,0) & 1) << 2 |
                           (uint)(SUB321(auVar1 >> 0x1f,0) & 1) << 3 |
                           (uint)(SUB321(auVar1 >> 0x27,0) & 1) << 4 |
                           (uint)(SUB321(auVar1 >> 0x2f,0) & 1) << 5 |
                           (uint)(SUB321(auVar1 >> 0x37,0) & 1) << 6 |
                           (uint)(SUB321(auVar1 >> 0x3f,0) & 1) << 7 |
                           (uint)(SUB321(auVar1 >> 0x47,0) & 1) << 8 |
                           (uint)(SUB321(auVar1 >> 0x4f,0) & 1) << 9 |
                           (uint)(SUB321(auVar1 >> 0x57,0) & 1) << 10 |
                           (uint)(SUB321(auVar1 >> 0x5f,0) & 1) << 0xb |
                           (uint)(SUB321(auVar1 >> 0x67,0) & 1) << 0xc |
                           (uint)(SUB321(auVar1 >> 0x6f,0) & 1) << 0xd |
                           (uint)(SUB321(auVar1 >> 0x77,0) & 1) << 0xe |
                           (uint)SUB321(auVar1 >> 0x7f,0) << 0xf |
                           (uint)(SUB321(auVar1 >> 0x87,0) & 1) << 0x10 |
                           (uint)(SUB321(auVar1 >> 0x8f,0) & 1) << 0x11 |
                           (uint)(SUB321(auVar1 >> 0x97,0) & 1) << 0x12 |
                           (uint)(SUB321(auVar1 >> 0x9f,0) & 1) << 0x13 |
                           (uint)(SUB321(auVar1 >> 0xa7,0) & 1) << 0x14 |
                           (uint)(SUB321(auVar1 >> 0xaf,0) & 1) << 0x15 |
                           (uint)(SUB321(auVar1 >> 0xb7,0) & 1) << 0x16 |
                           (uint)SUB321(auVar1 >> 0xbf,0) << 0x17 |
                           (uint)(SUB321(auVar1 >> 199,0) & 1) << 0x18 |
                           (uint)(SUB321(auVar1 >> 0xcf,0) & 1) << 0x19 |
                           (uint)(SUB321(auVar1 >> 0xd7,0) & 1) << 0x1a |
                           (uint)(SUB321(auVar1 >> 0xdf,0) & 1) << 0x1b |
                           (uint)(SUB321(auVar1 >> 0xe7,0) & 1) << 0x1c |
                           (uint)(SUB321(auVar1 >> 0xef,0) & 1) << 0x1d |
                           (uint)(SUB321(auVar1 >> 0xf7,0) & 1) << 0x1e |
                           (uint)(byte)((ulong)in_stack_ffffffffffffff58 >> 0x3f) << 0x1f);
      local_138 = local_1b0 << ((char)local_148 - ((char)local_128 + '0') & 0x3fU) | local_138;
      uVar6 = local_148 - 0x10;
      local_148 = local_148 + 0x30;
      for (; local_128 < uVar6; local_128 = uVar7 + local_128) {
        uVar7 = masked_vbyte_read_group
                          (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                           in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
        local_138 = local_138 >> ((byte)uVar7 & 0x3f);
        if (local_138 == 0xffffffffffffffff) {
          return 0;
        }
        local_130 = local_1d0 + local_130;
      }
    } while (local_130 + 0x70 < uVar5);
    local_13c = (int)local_148 - (int)local_128;
  }
  for (; (long)local_13c + local_130 < uVar5; local_13c = local_13c - (int)uVar7) {
    if (local_13c < 0x10) {
      if ((long)local_13c + local_130 + 0x1f < uVar5) {
        local_13c = local_13c + 0x20;
      }
      else {
        if (uVar5 <= (long)local_13c + local_130 + 0xf) break;
        vlddqu_avx(*(undefined1 (*) [16])(*in_RDI + local_128 + (long)local_13c));
        local_13c = local_13c + 0x10;
      }
    }
    uVar7 = masked_vbyte_read_group
                      (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60
                       ,in_stack_ffffffffffffff58);
    local_128 = uVar7 + local_128;
    local_130 = local_1f0 + local_130;
  }
  for (; local_130 < uVar5; local_130 = local_130 + 1) {
    iVar4 = read_int(*in_RDI + local_128,(uint32_t *)(in_RSI + local_130 * 4));
    local_128 = (long)iVar4 + local_128;
  }
  return local_128;
}

Assistant:

size_t masked_vbyte_read_loop(const uint8_t *in, uint32_t *out,
                              int len_signed) {
  uint64_t length = (uint64_t)len_signed; // number of ints we want to decode
  size_t consumed = 0;                    // number of bytes read
  uint64_t count = 0; // how many integers we have read so far

  uint64_t sig = 0;
  int availablebytes = 0;
  if (96 < length) {
    size_t scanned = 0;

#ifdef __AVX2__
    __m256i low = _mm256_loadu_si256((__m256i *)(in + scanned));
    uint32_t lowSig = _mm256_movemask_epi8(low);
#else
    __m128i low1 = _mm_loadu_si128((__m128i *)(in + scanned));
    uint32_t lowSig1 = _mm_movemask_epi8(low1);
    __m128i low2 = _mm_loadu_si128((__m128i *)(in + scanned + 16));
    uint32_t lowSig2 = _mm_movemask_epi8(low2);
    uint32_t lowSig = lowSig2 << 16;
    lowSig |= lowSig1;
#endif

    // excess verbosity to avoid problems with sign extension on conversions
    // better to think about what's happening and make it clearer
    __m128i high = _mm_loadu_si128((__m128i *)(in + scanned + 32));
    uint32_t highSig = _mm_movemask_epi8(high);
    uint64_t nextSig = highSig;
    nextSig <<= 32;
    nextSig |= lowSig;
    scanned += 48;

    do {
      uint64_t thisSig = nextSig;

#ifdef __AVX2__
      low = _mm256_loadu_si256((__m256i *)(in + scanned));
      lowSig = _mm256_movemask_epi8(low);
#else
      low1 = _mm_loadu_si128((__m128i *)(in + scanned));
      lowSig1 = _mm_movemask_epi8(low1);
      low2 = _mm_loadu_si128((__m128i *)(in + scanned + 16));
      lowSig2 = _mm_movemask_epi8(low2);
      lowSig = lowSig2 << 16;
      lowSig |= lowSig1;
#endif

      high = _mm_loadu_si128((__m128i *)(in + scanned + 32));
      highSig = _mm_movemask_epi8(high);
      nextSig = highSig;
      nextSig <<= 32;
      nextSig |= lowSig;

      uint64_t remaining = scanned - (consumed + 48);
      sig = (thisSig << remaining) | sig;

      uint64_t reload = scanned - 16;
      scanned += 48;

      // need to reload when less than 16 scanned bytes remain in sig
      while (consumed < reload) {
        uint64_t ints_read;
        uint64_t bytes = masked_vbyte_read_group(in + consumed, out + count,
                                                 sig, &ints_read);
        sig >>= bytes;

        // seems like this might force the compiler to prioritize shifting sig
        // >>= bytes
        if (sig == 0xFFFFFFFFFFFFFFFF)
          return 0; // fake check to force earliest evaluation

        consumed += bytes;
        count += ints_read;
      }
    } while (count + 112 < length); // 112 == 48 + 48 ahead for scanning + up to
                                    // 16 remaining in sig
    sig = (nextSig << (scanned - consumed - 48)) | sig;
    availablebytes = (int)(scanned - consumed);
  }
  while (availablebytes + count < length) {
    if (availablebytes < 16) {
      if (availablebytes + count + 31 < length) {
#ifdef __AVX2__
        uint64_t newsigavx = (uint32_t)_mm256_movemask_epi8(
            _mm256_loadu_si256((__m256i *)(in + availablebytes + consumed)));
        sig |= (newsigavx << availablebytes);
#else
        uint64_t newsig = _mm_movemask_epi8(
            _mm_lddqu_si128((const __m128i *)(in + availablebytes + consumed)));
        uint64_t newsig2 = _mm_movemask_epi8(_mm_lddqu_si128(
            (const __m128i *)(in + availablebytes + 16 + consumed)));
        sig |= (newsig << availablebytes) | (newsig2 << (availablebytes + 16));
#endif
        availablebytes += 32;
      } else if (availablebytes + count + 15 < length) {
        int newsig = _mm_movemask_epi8(
            _mm_lddqu_si128((const __m128i *)(in + availablebytes + consumed)));
        sig |= newsig << availablebytes;
        availablebytes += 16;
      } else {
        break;
      }
    }
    uint64_t ints_read;

    uint64_t eaten =
        masked_vbyte_read_group(in + consumed, out + count, sig, &ints_read);
    consumed += eaten;
    availablebytes -= eaten;
    sig >>= eaten;
    count += ints_read;
  }
  for (; count < length; count++) {
    consumed += read_int(in + consumed, out + count);
  }
  return consumed;
}